

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListF
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  GrammarResolver *this_00;
  SchemaElementDecl *subsElemDecl_00;
  SchemaElementDecl *elem_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this_01;
  SchemaGrammar *this_02;
  SchemaElementDecl **ppSVar3;
  ComplexTypeInfo *typeInfo;
  DatatypeValidator *validator;
  SchemaElementDecl *local_88;
  SchemaElementDecl *chainElem;
  XMLSize_t i;
  XMLSize_t elemSize;
  SchemaGrammar *local_60;
  SchemaGrammar *aGrammar;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *validSubs;
  XMLCh *subsElemName;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVStack_40;
  int subsElemURI;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *validSubsElements;
  XMLCh *elemName;
  SchemaElementDecl *pSStack_28;
  int elemURI;
  SchemaElementDecl *subsElemDecl_local;
  SchemaElementDecl *elemDecl_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pSStack_28 = subsElemDecl;
  subsElemDecl_local = elemDecl;
  elemDecl_local = (SchemaElementDecl *)elem;
  elem_local = (DOMElement *)this;
  elemName._4_4_ = XMLElementDecl::getURI(&elemDecl->super_XMLElementDecl);
  validSubsElements =
       (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
       XMLElementDecl::getBaseName(&subsElemDecl_local->super_XMLElementDecl);
  pVStack_40 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this->fValidSubstitutionGroups,validSubsElements,elemName._4_4_);
  if (pVStack_40 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    return;
  }
  subsElemName._4_4_ = XMLElementDecl::getURI(&pSStack_28->super_XMLElementDecl);
  validSubs = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
              XMLElementDecl::getBaseName(&pSStack_28->super_XMLElementDecl);
  aGrammar = (SchemaGrammar *)
             RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fValidSubstitutionGroups,validSubs,subsElemName._4_4_);
  if (aGrammar == (SchemaGrammar *)0x0) {
    if (this->fTargetNSURI == subsElemName._4_4_) {
      return;
    }
    this_00 = this->fGrammarResolver;
    iVar2 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,(ulong)subsElemName._4_4_);
    local_60 = (SchemaGrammar *)
               GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar2));
    if (local_60 == (SchemaGrammar *)0x0) {
      return;
    }
    this_01 = SchemaGrammar::getValidSubstitutionGroups(local_60);
    aGrammar = (SchemaGrammar *)
               RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this_01,validSubs,subsElemName._4_4_);
    if (aGrammar == (SchemaGrammar *)0x0) {
      return;
    }
    this_02 = (SchemaGrammar *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
              ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)this_02,
               (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar);
    aGrammar = this_02;
    RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::put(this->fValidSubstitutionGroups,validSubs,subsElemName._4_4_,
          (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)this_02);
  }
  i = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::size(pVStack_40);
  for (chainElem = (SchemaElementDecl *)0x0; chainElem < i;
      chainElem = (SchemaElementDecl *)
                  ((long)&(chainElem->super_XMLElementDecl).super_XSerializable._vptr_XSerializable
                  + 1)) {
    ppSVar3 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt
                        (pVStack_40,(XMLSize_t)chainElem);
    local_88 = *ppSVar3;
    bVar1 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                      ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,&local_88,0);
    elem_00 = elemDecl_local;
    subsElemDecl_00 = pSStack_28;
    if (!bVar1) {
      typeInfo = SchemaElementDecl::getComplexTypeInfo(local_88);
      validator = SchemaElementDecl::getDatatypeValidator(local_88);
      bVar1 = isSubstitutionGroupValid
                        (this,(DOMElement *)elem_00,subsElemDecl_00,typeInfo,validator,(XMLCh *)0x0,
                         false);
      if (bVar1) {
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement
                  ((ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)aGrammar,&local_88);
        buildValidSubstitutionListB(this,(DOMElement *)elemDecl_local,local_88,pSStack_28);
      }
    }
  }
  return;
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListF(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    int elemURI = elemDecl->getURI();
    XMLCh* elemName = elemDecl->getBaseName();
    ValueVectorOf<SchemaElementDecl*>* validSubsElements =fValidSubstitutionGroups->get(elemName, elemURI);

    if (validSubsElements) {

        int subsElemURI = subsElemDecl->getURI();
        XMLCh* subsElemName = subsElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubs = fValidSubstitutionGroups->get(subsElemName, subsElemURI);

        if (!validSubs) {

            if (fTargetNSURI == subsElemURI) {
                return; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

            if (!aGrammar)
                return;

            validSubs = aGrammar->getValidSubstitutionGroups()->get(subsElemName, subsElemURI);

            if (!validSubs) {
                return;
            }

            validSubs = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubs);
            fValidSubstitutionGroups->put((void*) subsElemName, subsElemURI, validSubs);
        }

        XMLSize_t elemSize = validSubsElements->size();
        for (XMLSize_t i=0; i<elemSize; i++) {

            SchemaElementDecl* chainElem = validSubsElements->elementAt(i);

            if (validSubs->containsElement(chainElem)) {
                continue;
            }

            if (isSubstitutionGroupValid(elem, subsElemDecl, chainElem->getComplexTypeInfo(),
                                         chainElem->getDatatypeValidator(), 0, false)) {
                validSubs->addElement(chainElem);
                buildValidSubstitutionListB(elem, chainElem, subsElemDecl);
            }
        }
    }
}